

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O0

int xml_parse_file_flags(xar *xar,char *name)

{
  int iVar1;
  char *local_28;
  char *flag;
  char *name_local;
  xar *xar_local;
  
  local_28 = (char *)0x0;
  iVar1 = strcmp(name,"UserNoDump");
  if (iVar1 == 0) {
    xar->xmlsts = FILE_FLAGS_USER_NODUMP;
    local_28 = "nodump";
  }
  else {
    iVar1 = strcmp(name,"UserImmutable");
    if (iVar1 == 0) {
      xar->xmlsts = FILE_FLAGS_USER_IMMUTABLE;
      local_28 = "uimmutable";
    }
    else {
      iVar1 = strcmp(name,"UserAppend");
      if (iVar1 == 0) {
        xar->xmlsts = FILE_FLAGS_USER_APPEND;
        local_28 = "uappend";
      }
      else {
        iVar1 = strcmp(name,"UserOpaque");
        if (iVar1 == 0) {
          xar->xmlsts = FILE_FLAGS_USER_OPAQUE;
          local_28 = "opaque";
        }
        else {
          iVar1 = strcmp(name,"UserNoUnlink");
          if (iVar1 == 0) {
            xar->xmlsts = FILE_FLAGS_USER_NOUNLINK;
            local_28 = "nouunlink";
          }
          else {
            iVar1 = strcmp(name,"SystemArchived");
            if (iVar1 == 0) {
              xar->xmlsts = FILE_FLAGS_SYS_ARCHIVED;
              local_28 = "archived";
            }
            else {
              iVar1 = strcmp(name,"SystemImmutable");
              if (iVar1 == 0) {
                xar->xmlsts = FILE_FLAGS_SYS_IMMUTABLE;
                local_28 = "simmutable";
              }
              else {
                iVar1 = strcmp(name,"SystemAppend");
                if (iVar1 == 0) {
                  xar->xmlsts = FILE_FLAGS_SYS_APPEND;
                  local_28 = "sappend";
                }
                else {
                  iVar1 = strcmp(name,"SystemNoUnlink");
                  if (iVar1 == 0) {
                    xar->xmlsts = FILE_FLAGS_SYS_NOUNLINK;
                    local_28 = "nosunlink";
                  }
                  else {
                    iVar1 = strcmp(name,"SystemSnapshot");
                    if (iVar1 == 0) {
                      xar->xmlsts = FILE_FLAGS_SYS_SNAPSHOT;
                      local_28 = "snapshot";
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (local_28 == (char *)0x0) {
    xar_local._4_4_ = 0;
  }
  else {
    xar->file->has = xar->file->has | 0x1000;
    if ((xar->file->fflags_text).length != 0) {
      archive_strappend_char(&xar->file->fflags_text,',');
    }
    archive_strcat(&xar->file->fflags_text,local_28);
    xar_local._4_4_ = 1;
  }
  return xar_local._4_4_;
}

Assistant:

static int
xml_parse_file_flags(struct xar *xar, const char *name)
{
	const char *flag = NULL;

	if (strcmp(name, "UserNoDump") == 0) {
		xar->xmlsts = FILE_FLAGS_USER_NODUMP;
		flag = "nodump";
	}
	else if (strcmp(name, "UserImmutable") == 0) {
		xar->xmlsts = FILE_FLAGS_USER_IMMUTABLE;
		flag = "uimmutable";
	}
	else if (strcmp(name, "UserAppend") == 0) {
		xar->xmlsts = FILE_FLAGS_USER_APPEND;
		flag = "uappend";
	}
	else if (strcmp(name, "UserOpaque") == 0) {
		xar->xmlsts = FILE_FLAGS_USER_OPAQUE;
		flag = "opaque";
	}
	else if (strcmp(name, "UserNoUnlink") == 0) {
		xar->xmlsts = FILE_FLAGS_USER_NOUNLINK;
		flag = "nouunlink";
	}
	else if (strcmp(name, "SystemArchived") == 0) {
		xar->xmlsts = FILE_FLAGS_SYS_ARCHIVED;
		flag = "archived";
	}
	else if (strcmp(name, "SystemImmutable") == 0) {
		xar->xmlsts = FILE_FLAGS_SYS_IMMUTABLE;
		flag = "simmutable";
	}
	else if (strcmp(name, "SystemAppend") == 0) {
		xar->xmlsts = FILE_FLAGS_SYS_APPEND;
		flag = "sappend";
	}
	else if (strcmp(name, "SystemNoUnlink") == 0) {
		xar->xmlsts = FILE_FLAGS_SYS_NOUNLINK;
		flag = "nosunlink";
	}
	else if (strcmp(name, "SystemSnapshot") == 0) {
		xar->xmlsts = FILE_FLAGS_SYS_SNAPSHOT;
		flag = "snapshot";
	}

	if (flag == NULL)
		return (0);
	xar->file->has |= HAS_FFLAGS;
	if (archive_strlen(&(xar->file->fflags_text)) > 0)
		archive_strappend_char(&(xar->file->fflags_text), ',');
	archive_strcat(&(xar->file->fflags_text), flag);
	return (1);
}